

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZHybridizeHDiv.cpp
# Opt level: O2

void __thiscall
TPZHybridizeHDiv::GetAllConnectedCompElSides
          (TPZHybridizeHDiv *this,TPZInterpolatedElement *intel,int side,
          TPZStack<TPZCompElSide,_10> *celsidestack)

{
  TPZDepend *pTVar1;
  int iVar2;
  int iVar3;
  TPZConnect *pTVar4;
  TPZGeoEl *pTVar5;
  TPZGeoEl *pTVar6;
  long lVar7;
  TPZCompElSide *object;
  TPZGeoElSide gelside;
  TPZCompElSide local_110;
  TPZCompElSide local_100;
  TPZStack<TPZCompElSide,_10> celstack;
  
  pTVar4 = TPZInterpolatedElement::SideConnect(intel,0,side);
  pTVar1 = pTVar4->fDependList;
  pTVar5 = TPZCompEl::Reference((TPZCompEl *)intel);
  gelside.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoElSide_0172da80;
  gelside.fGeoEl = pTVar5;
  gelside.fSide = side;
  if (pTVar1 != (TPZDepend *)0x0) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZHybridizeHDiv.cpp"
               ,0x418);
  }
  TPZStack<TPZCompElSide,_10>::TPZStack(&celstack);
  TPZGeoElSide::EqualLevelCompElementList(&gelside,&celstack,1,0);
  lVar7 = 0;
  do {
    if (celstack.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.fNElements << 4
        == lVar7) {
      TPZManVector<TPZCompElSide,_10>::~TPZManVector
                (&celstack.super_TPZManVector<TPZCompElSide,_10>);
      return;
    }
    pTVar6 = TPZCompEl::Reference
                       (*(TPZCompEl **)
                         ((long)&(celstack.super_TPZManVector<TPZCompElSide,_10>.
                                  super_TPZVec<TPZCompElSide>.fStore)->fEl + lVar7));
    iVar2 = (**(code **)(*(long *)pTVar6 + 0x210))(pTVar6);
    iVar3 = (**(code **)(*(long *)pTVar5 + 0x210))(pTVar5);
    if (iVar2 == iVar3) {
      pTVar6 = TPZCompEl::Reference
                         (*(TPZCompEl **)
                           ((long)&(celstack.super_TPZManVector<TPZCompElSide,_10>.
                                    super_TPZVec<TPZCompElSide>.fStore)->fEl + lVar7));
      if (this->fIdToHybridize == -1000) {
        local_110.fEl =
             *(TPZCompEl **)
              ((long)&(celstack.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.
                      fStore)->fEl + lVar7);
        object = &local_110;
      }
      else {
        if (pTVar6->fMatId != this->fIdToHybridize) goto LAB_01258a31;
        local_100.fEl =
             *(TPZCompEl **)
              ((long)&(celstack.super_TPZManVector<TPZCompElSide,_10>.super_TPZVec<TPZCompElSide>.
                      fStore)->fEl + lVar7);
        object = &local_100;
      }
      object->fSide =
           *(int *)((long)&(celstack.super_TPZManVector<TPZCompElSide,_10>.
                            super_TPZVec<TPZCompElSide>.fStore)->fSide + lVar7);
      TPZStack<TPZCompElSide,_10>::push_back(celsidestack,object);
    }
LAB_01258a31:
    lVar7 = lVar7 + 0x10;
  } while( true );
}

Assistant:

void TPZHybridizeHDiv::GetAllConnectedCompElSides(TPZInterpolatedElement *intel, int side, TPZStack<TPZCompElSide> &celsidestack) {
    bool isrestrained = false;
    {
        TPZConnect &c = intel->SideConnect(0, side);
        if (c.HasDependency()) {
            isrestrained = true;
        }
    }
    TPZGeoEl *gel = intel->Reference();
    TPZGeoElSide gelside(gel, side);

    if (isrestrained == true) {
        /// if the side is restrained we will hybridize between the element and the larger element
        DebugStop();
    } else {
        // if the connect is not restrained
        // - the neighbour should be of the same dimension
        //   if the neighbour is of lower dimension it is a boundary element
        TPZStack<TPZCompElSide> celstack;
        gelside.EqualLevelCompElementList(celstack, 1, 0);
        for (auto& cel : celstack) {
            TPZGeoEl *neigh = cel.Element()->Reference();
            if (neigh->Dimension() == gel->Dimension()) {
                const int celmatid = cel.Element()->Reference()->MaterialId();
                if (fIdToHybridize != -1000) {
                    if (celmatid == fIdToHybridize) {
                        celsidestack.push_back(cel);
                    }
                }
                else {
                    celsidestack.push_back(cel);
                }
                
            }
        } // cel
    } // else
}